

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O1

bool __thiscall BinGE<0,_0,_0>::propagate(BinGE<0,_0,_0> *this)

{
  IntVar *pIVar1;
  IntVar *pIVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  bool bVar7;
  int64_t m_v_1;
  int64_t m_v;
  TrailElem local_30;
  
  pIVar1 = (this->x).var;
  pIVar2 = (this->y).var;
  iVar5 = (pIVar1->max).v;
  iVar4 = (pIVar2->min).v;
  if ((pIVar1->min).v < iVar4) {
    if (so.lazy) {
      iVar3 = (*(pIVar2->super_Var).super_Branching._vptr_Branching[8])();
      lVar6 = (long)iVar3 * 4 + 2;
    }
    else {
      lVar6 = 0;
    }
    pIVar1 = (this->x).var;
    iVar4 = (*(pIVar1->super_Var).super_Branching._vptr_Branching[0xe])(pIVar1,(long)iVar4,lVar6,1);
    if ((char)iVar4 != '\0') goto LAB_001b53c4;
LAB_001b544d:
    bVar7 = false;
  }
  else {
LAB_001b53c4:
    if (iVar5 < (((this->y).var)->max).v) {
      if (so.lazy == true) {
        iVar4 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[9])();
        lVar6 = (long)iVar4 * 4 + 2;
      }
      else {
        lVar6 = 0;
      }
      pIVar1 = (this->y).var;
      iVar5 = (*(pIVar1->super_Var).super_Branching._vptr_Branching[0xf])
                        (pIVar1,(long)iVar5,lVar6,1);
      if ((char)iVar5 == '\0') goto LAB_001b544d;
    }
    bVar7 = true;
    if ((((this->y).var)->max).v <= (((this->x).var)->min).v) {
      local_30.pt = (int *)&(this->super_Propagator).satisfied;
      local_30.x = (int)(this->super_Propagator).satisfied.v;
      local_30.sz = 1;
      vec<TrailElem>::push(&engine.trail,&local_30);
      (this->super_Propagator).satisfied.v = '\x01';
    }
  }
  return bVar7;
}

Assistant:

bool propagate() override {
		if ((R != 0) && r.isFalse()) {
			return true;
		}

		const int64_t x_max = x.getMax();
		const int64_t y_min = y.getMin();

		// Can finesse!!
		if ((R != 0) && x_max < y_min) {
			setDom(r, setVal, 0, x.getMaxLit(), y.getMinLit());
		}

		if ((R != 0) && !r.isTrue()) {
			return true;
		}

		// Finesses x's lower bound
		if (R != 0) {
			setDom(x, setMin, y_min, y.getMinLit(), r.getValLit());
		} else {
			setDom(x, setMin, y_min, y.getMinLit());
		}
		if (R != 0) {
			setDom(y, setMax, x_max, x.getMaxLit(), r.getValLit());
		} else {
			setDom(y, setMax, x_max, x.getMaxLit());
		}

		if (x.getMin() >= y.getMax()) {
			satisfied = true;
		}

		return true;
	}